

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analyserexternalvariable.cpp
# Opt level: O1

VariablePtr __thiscall
libcellml::AnalyserExternalVariable::dependency
          (AnalyserExternalVariable *this,ModelPtr *model,string *componentName,string *variableName
          )

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  AnalyserExternalVariableImpl *pAVar2;
  iterator iVar3;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  string *in_R8;
  VariablePtr VVar4;
  
  iVar3 = AnalyserExternalVariableImpl::findDependency
                    ((AnalyserExternalVariableImpl *)
                     (model->super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>).
                     _M_ptr,(ModelPtr *)componentName,variableName,in_R8);
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)iVar3._M_current ==
      (((model->super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
      super_enable_shared_from_this<libcellml::Model>)._M_weak_this.
      super___weak_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi) {
    this->mPimpl = (AnalyserExternalVariableImpl *)0x0;
    this[1].mPimpl = (AnalyserExternalVariableImpl *)0x0;
  }
  else {
    this->mPimpl = (AnalyserExternalVariableImpl *)
                   ((iVar3._M_current)->
                   super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    pAVar2 = (AnalyserExternalVariableImpl *)
             ((iVar3._M_current)->
             super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi;
    this[1].mPimpl = pAVar2;
    if (pAVar2 != (AnalyserExternalVariableImpl *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Var1 = &(pAVar2->mVariable).
                  super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
        *(int *)&p_Var1->_M_pi = *(int *)&p_Var1->_M_pi + 1;
        UNLOCK();
      }
      else {
        p_Var1 = &(pAVar2->mVariable).
                  super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
        *(int *)&p_Var1->_M_pi = *(int *)&p_Var1->_M_pi + 1;
      }
    }
  }
  VVar4.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  VVar4.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (VariablePtr)VVar4.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

VariablePtr AnalyserExternalVariable::dependency(const ModelPtr &model,
                                                 const std::string &componentName,
                                                 const std::string &variableName) const
{
    auto result = mPimpl->findDependency(model, componentName, variableName);

    return (result != mPimpl->mDependencies.end()) ?
               *result :
               nullptr;
}